

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O3

void PPrintSection(TidyDocImpl *doc,uint indent,Node *node)

{
  uint uVar1;
  uint mode;
  
  uVar1 = *(uint *)((doc->config).value + 0x5d);
  mode = 0x10;
  if (*(int *)((doc->config).value + 0x60) == 0) {
    prvTidySetOptionInt(doc,TidyWrapLen,0xffffffff);
    mode = 2;
  }
  AddString(&doc->pprint,"<![");
  PPrintText(doc,mode,indent,node);
  AddString(&doc->pprint,"]>");
  prvTidySetOptionInt(doc,TidyWrapLen,(ulong)uVar1);
  return;
}

Assistant:

static void PPrintSection( TidyDocImpl* doc, uint indent, Node *node )
{
    TidyPrintImpl* pprint = &doc->pprint;
    Bool wrapSect = cfgBool( doc, TidyWrapSection );
    uint saveWrap = WrapOffCond( doc, !wrapSect  );

    AddString( pprint, "<![" );
    PPrintText( doc, (wrapSect ? CDATA : COMMENT),
                indent, node );
    AddString( pprint, "]>" );

    /* PCondFlushLine( doc, indent ); */
    WrapOn( doc, saveWrap );
}